

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsd_filters.cpp
# Opt level: O2

float __thiscall
DSDcc::DSDMBEAudioInterpolatorFilter::run(DSDMBEAudioInterpolatorFilter *this,float *sample)

{
  float fVar1;
  float local_c;
  
  if (this->m_useHP == true) {
    local_c = IIRFilter<float,_2U>::run(&this->m_filterHP,sample);
    fVar1 = IIRFilter<float,_2U>::run(&this->m_filterLP,&local_c);
    return fVar1;
  }
  fVar1 = IIRFilter<float,_2U>::run(&this->m_filterLP,sample);
  return fVar1;
}

Assistant:

float DSDMBEAudioInterpolatorFilter::run(const float& sample)
{
    return m_useHP ? m_filterLP.run(m_filterHP.run(sample)) : m_filterLP.run(sample);
}